

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,__1,__1,_0,__1,__1> *dst,
               CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
               *src,assign_op<float,_float> *func)

{
  assign_op<float,_float> *func_00;
  Matrix<float,__1,__1,_0,__1,__1> *dstExpr;
  undefined1 local_68 [8];
  Kernel kernel;
  DstEvaluatorType dstEvaluator;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>
  local_22;
  assign_op<float,_float> *paStack_20;
  SrcEvaluatorType srcEvaluator;
  assign_op<float,_float> *func_local;
  CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>
  *src_local;
  Matrix<float,__1,__1,_0,__1,__1> *dst_local;
  
  paStack_20 = func;
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>
  ::evaluator(&local_22,src);
  resize_if_allowed<Eigen::Matrix<float,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,Eigen::Matrix<float,_1,_1,0,_1,_1>>,float,float>
            (dst,src,paStack_20);
  evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::evaluator
            ((evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&kernel.m_dstExpr,dst);
  func_00 = paStack_20;
  dstExpr = EigenBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::const_cast_derived
                      ((EigenBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)dst);
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
  ::generic_dense_assignment_kernel
            ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
              *)local_68,(DstEvaluatorType *)&kernel.m_dstExpr,&local_22,func_00,dstExpr);
  dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>,_1,_0>
  ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::assign_op<float,_float>,_0>
         *)local_68);
  evaluator<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::~evaluator
            ((evaluator<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&kernel.m_dstExpr);
  evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<float>,_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>_>
  ::~evaluator(&local_22);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}